

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O3

void __thiscall calculator::ExpressionTree::parseExpression(ExpressionTree *this,string *text)

{
  SyntaxError *this_00;
  string local_40;
  
  Reader::set_buffer(&(this->lexer_).reader_,text);
  std::
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>::
  clear(&(this->lexer_).tokenlist_);
  while ((this->lexer_).reader_.ptr_ < (this->lexer_).reader_.len_) {
    Lexer::scan(&this->lexer_);
  }
  if ((this->lexer_).bracket_match_.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (this->lexer_).bracket_match_.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    return;
  }
  this_00 = (SyntaxError *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"expression unexpected )!","")
  ;
  SyntaxError::SyntaxError(this_00,&local_40);
  __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
}

Assistant:

void ExpressionTree::parseExpression(const std::string &text) {
    // 重新设置文本串
    lexer_.reader().set_buffer(text);
    // 清除token
    lexer_.tokenList().clear();
    // 词法分析阶段开始
    while (!lexer_.reader().eof()) lexer_.scan();

    // 然后判断表达式是否括号匹配
    if (!lexer_.bm().empty()) throw SyntaxError("expression unexpected )!");
}